

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O3

void ncnn::get_text_drawing_size(char *text,int fontpixelsize,int *w,int *h)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = 0;
  *w = 0;
  *h = 0;
  sVar3 = strlen(text);
  if (0 < (int)(uint)sVar3) {
    uVar5 = 0;
    iVar4 = 0;
    do {
      cVar1 = text[uVar5];
      if (cVar1 == 10) {
        if (iVar4 < *w) {
          iVar4 = *w;
        }
        *w = iVar4;
        *h = *h + fontpixelsize * 2;
        iVar4 = 0;
      }
      iVar2 = isprint((int)cVar1);
      if (iVar2 != 0) {
        iVar2 = fontpixelsize;
      }
      iVar4 = iVar2 + iVar4;
      uVar5 = uVar5 + 1;
    } while (((uint)sVar3 & 0x7fffffff) != uVar5);
  }
  if (iVar4 < *w) {
    iVar4 = *w;
  }
  *w = iVar4;
  *h = *h + fontpixelsize * 2;
  return;
}

Assistant:

void get_text_drawing_size(const char* text, int fontpixelsize, int* w, int* h)
{
    *w = 0;
    *h = 0;

    const int n = strlen(text);

    int line_w = 0;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            *w = std::max(*w, line_w);
            *h += fontpixelsize * 2;
            line_w = 0;
        }

        if (isprint(ch) != 0)
        {
            line_w += fontpixelsize;
        }
    }

    *w = std::max(*w, line_w);
    *h += fontpixelsize * 2;
}